

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastzip.cpp
# Opt level: O1

void __thiscall
Fastzip::packZipData
          (Fastzip *this,File *f,int size,PackFormat inFormat,PackFormat outFormat,uint8_t *sha,
          ZipEntry *target)

{
  uchar *puVar1;
  File *f_00;
  uint32_t uVar2;
  int iVar3;
  uint8_t *puVar4;
  size_t sVar5;
  long *plVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  uint **ppuVar9;
  size_type *psVar10;
  undefined4 in_register_00000014;
  undefined4 in_register_00000084;
  ulong uVar11;
  ulong uVar12;
  undefined1 local_140 [16];
  uint *local_130;
  long lStack_128;
  long local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Fastzip *local_98;
  uint32_t *local_90;
  undefined8 local_88;
  long *local_80 [2];
  long local_70 [2];
  ulong local_60;
  File *local_58;
  undefined8 local_50;
  uint8_t *local_48;
  ulong local_40;
  size_t outSize;
  
  local_88 = CONCAT44(in_register_00000084,outFormat);
  local_50 = CONCAT44(in_register_00000014,size);
  uVar12 = (ulong)size;
  uVar11 = (ulong)((size / 0x3fff) * 5 + size + 0x10005);
  local_98 = this;
  local_40 = uVar11;
  outSize._4_4_ = inFormat;
  puVar4 = (uint8_t *)operator_new__(uVar11);
  memset(puVar4,0,uVar11);
  target->store = false;
  local_60 = uVar12;
  if (size == 0) {
    store_uncompressed(f,0,puVar4,&local_40,&target->crc,sha);
    puVar1 = (target->data)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (target->data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
    _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar4;
    if (puVar1 != (uchar *)0x0) {
      operator_delete__(puVar1);
    }
    target->store = true;
    local_40 = 0;
  }
  else {
    local_58 = f;
    local_48 = puVar4;
    if (outSize._4_4_ == UNCOMPRESSED) {
      local_e0 = ftell((FILE *)f->fp_);
      uVar12 = local_60;
      local_90 = &target->crc;
      if ((int)local_88 - 1U < 9) {
        puVar4 = local_48 + (uVar11 - local_60);
        sVar5 = fread(puVar4,1,local_60,(FILE *)f->fp_);
        outSize._4_4_ = ~UNCOMPRESSED;
        if ((int)sVar5 == (int)local_50) {
          if (sha != (uint8_t *)0x0) {
            SHA1_Init((SHA_CTX *)local_140);
            SHA1_Update((SHA_CTX *)local_140,puVar4,uVar12);
            SHA1_Final(sha,(SHA_CTX *)local_140);
          }
          uVar2 = crc32_fast(puVar4,uVar12,0);
          *local_90 = uVar2;
          uVar11 = iz_deflate((int)local_88,(char *)local_48,(char *)puVar4,uVar11,uVar12);
          if (uVar11 != 0xffffffffffffffff) {
            if (uVar11 == 0xfffffffffffffffe) {
              outSize._4_4_ = ZIP1_COMPRESSED;
              local_40 = (long)((int)local_50 * 8);
            }
            else {
              outSize._4_4_ = UNCOMPRESSED;
              local_40 = uVar11;
            }
          }
        }
        local_40 = local_40 + 7 >> 3;
      }
      else {
        outSize._4_4_ = ZIP1_COMPRESSED;
        store_uncompressed(f,(int)local_50,local_48,&local_40,local_90,sha);
        uVar12 = local_60;
      }
      if (outSize._4_4_ == ~UNCOMPRESSED) {
        local_80[0] = local_70;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_80,"Compression failed! Storing \'","");
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)local_80,(ulong)(target->name)._M_dataplus._M_p);
        ppuVar9 = (uint **)(puVar7 + 2);
        if ((uint **)*puVar7 == ppuVar9) {
          local_130 = *ppuVar9;
          lStack_128 = puVar7[3];
          local_140._0_8_ = &local_130;
        }
        else {
          local_130 = *ppuVar9;
          local_140._0_8_ = (uint **)*puVar7;
        }
        local_140._8_8_ = puVar7[1];
        *puVar7 = ppuVar9;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append(local_140);
        psVar10 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_d8.field_2._M_allocated_capacity = *psVar10;
          local_d8.field_2._8_4_ = (undefined4)plVar6[3];
          local_d8.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *psVar10;
          local_d8._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_d8._M_string_length = plVar6[1];
        *plVar6 = (long)psVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((local_98->warning).super__Function_base._M_manager == (_Manager_type)0x0)
        goto LAB_0016de04;
        (*(local_98->warning)._M_invoker)((_Any_data *)&local_98->warning,&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((uint **)local_140._0_8_ != &local_130) {
          operator_delete((void *)local_140._0_8_,(long)local_130 + 1);
        }
        if (local_80[0] != local_70) {
          operator_delete(local_80[0],local_70[0] + 1);
        }
        f_00 = local_58;
        fseek((FILE *)local_58->fp_,local_e0,0);
        outSize._4_4_ = ZIP1_COMPRESSED;
        store_uncompressed(f_00,(int)local_50,local_48,&local_40,local_90,sha);
      }
      if (outSize._4_4_ == ZIP1_COMPRESSED) {
        target->store = true;
      }
      target->originalSize = uVar12;
      puVar4 = local_48;
    }
    else if ((int)local_88 == 10 && 0 < (int)outSize._4_4_) {
      store_compressed(f,(int)local_50,puVar4,sha);
      local_40 = local_60;
    }
    else {
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_80,"Unpacking not supported, storing \'","");
      uVar11 = local_60;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_80,(ulong)(target->name)._M_dataplus._M_p);
      ppuVar9 = (uint **)(plVar6 + 2);
      if ((uint **)*plVar6 == ppuVar9) {
        local_130 = *ppuVar9;
        lStack_128 = plVar6[3];
        local_140._0_8_ = &local_130;
      }
      else {
        local_130 = *ppuVar9;
        local_140._0_8_ = (uint **)*plVar6;
      }
      local_140._8_8_ = plVar6[1];
      *plVar6 = (long)ppuVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append(local_140);
      psVar10 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_b8.field_2._M_allocated_capacity = *psVar10;
        local_b8.field_2._8_4_ = (undefined4)plVar6[3];
        local_b8.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar10;
        local_b8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_b8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((local_98->warning).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
LAB_0016de04:
        uVar8 = std::__throw_bad_function_call();
        if ((uint **)local_140._0_8_ != &local_130) {
          operator_delete((void *)local_140._0_8_,(long)local_130 + 1);
        }
        if (local_80[0] != local_70) {
          operator_delete(local_80[0],local_70[0] + 1);
        }
        operator_delete__(local_48);
        _Unwind_Resume(uVar8);
      }
      (*(local_98->warning)._M_invoker)((_Any_data *)&local_98->warning,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((uint **)local_140._0_8_ != &local_130) {
        operator_delete((void *)local_140._0_8_,(long)local_130 + 1);
      }
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      puVar4 = local_48;
      iVar3 = store_compressed(local_58,(int)local_50,local_48,sha);
      target->originalSize = (long)iVar3;
      local_40 = uVar11;
    }
    puVar1 = (target->data)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (target->data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
    _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar4;
    if (puVar1 != (uchar *)0x0) {
      operator_delete__(puVar1);
    }
  }
  target->dataSize = local_40;
  return;
}

Assistant:

void Fastzip::packZipData(File& f, int size, PackFormat inFormat,
                          PackFormat outFormat, uint8_t* sha, ZipEntry& target)
{
    // Maximum size for deflate + space for buffer
    size_t outSize = size + (size / 16383 + 1) * 5 + 64 * 1024;
    auto outBuf = std::make_unique<uint8_t[]>(outSize);
    // auto outBuf = std::make_unique<uint8_t[]>(outSize);
    target.store = false;

    if (size == 0) {
        store_uncompressed(f, 0, outBuf.get(), &outSize, &target.crc, sha);
        target.data = std::move(outBuf);
        target.store = true;
        target.dataSize = 0;
        return;
    }

    if (inFormat == UNCOMPRESSED) {
        auto startPos = f.tell();
        PackResult state;

        if (outFormat >= ZIP1_COMPRESSED && outFormat <= ZIP9_COMPRESSED) {
            state = infozip_deflate(outFormat, f, size, outBuf.get(), &outSize,
                                    &target.crc, sha);
            outSize = (outSize + 7) >> 3;
        }
#ifdef WITH_INTEL
        else if (outFormat == INTEL_COMPRESSED)
            state = intel_deflate(f, size, outBuf.get(), &outSize, &target.crc,
                                  sha, earlyOut);
#endif
        else
            state = store_uncompressed(f, size, outBuf.get(), &outSize,
                                       &target.crc, sha);

        if (state == PackResult::FAILED) {
            warning(string("Compression failed! Storing '") + target.name +
                    "' as a fallback");
            f.seek(startPos);
            state = store_uncompressed(f, size, outBuf.get(), &outSize,
                                       &target.crc, sha);
        }
        if (state == PackResult::STORED)
            target.store = true;
        target.originalSize = size;
    } else if (inFormat > 0 && outFormat == COMPRESSED) {
        // Keep format, just inflate to calculate sha if necessary
        store_compressed(f, size, outBuf.get(), sha);
        outSize = size;
    } else {
        // Unpacking is not supported
        warning(string("Unpacking not supported, storing '") + target.name +
                "' with original compression");
        target.originalSize = store_compressed(f, size, outBuf.get(), sha);
        outSize = size;
    }

    target.data = std::move(outBuf);
    target.dataSize = outSize;
}